

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_derive_keys(mbedtls_ssl_context *ssl)

{
  mbedtls_cipher_context_t *ctx;
  uchar *puVar1;
  mbedtls_md_type_t mVar2;
  uint uVar3;
  mbedtls_ssl_session *pmVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  mbedtls_ssl_transform *pmVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uchar *key;
  uchar *key_00;
  uchar *key_01;
  byte bVar14;
  int iVar15;
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_md_info_t *md_info;
  long lVar16;
  ulong uVar17;
  int line;
  uint uVar18;
  code *pcVar19;
  code *pcVar20;
  size_t sVar21;
  code *pcVar22;
  char *pcVar23;
  mbedtls_cipher_context_t *ctx_00;
  uchar *puVar24;
  uchar *key_02;
  bool bVar25;
  uchar tmp [64];
  uchar keyblk [256];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  uchar local_138 [264];
  
  pmVar4 = ssl->session_negotiate;
  pmVar5 = ssl->handshake;
  pmVar6 = ssl->transform_negotiate;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1f6,"=> derive keys");
  cipher_info = mbedtls_cipher_info_from_type(pmVar6->ciphersuite_info->cipher);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    mVar2 = pmVar6->ciphersuite_info->cipher;
    pcVar23 = "cipher info for %d not found";
    iVar15 = 0x1fc;
LAB_0016288a:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,iVar15,pcVar23,(ulong)mVar2);
    return -0x7100;
  }
  md_info = mbedtls_md_info_from_type(pmVar6->ciphersuite_info->mac);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    mVar2 = pmVar6->ciphersuite_info->mac;
    pcVar23 = "mbedtls_md info for %d not found";
    iVar15 = 0x204;
    goto LAB_0016288a;
  }
  iVar15 = ssl->minor_ver;
  if (iVar15 == 0) {
    pcVar20 = ssl_calc_finished_ssl;
    pcVar19 = ssl_calc_verify_ssl;
    pcVar22 = ssl3_prf;
  }
  else if (iVar15 < 3) {
    pcVar20 = ssl_calc_finished_tls;
    pcVar19 = ssl_calc_verify_tls;
    pcVar22 = tls1_prf;
  }
  else {
    if (iVar15 != 3) {
      iVar15 = 0x233;
      goto LAB_00162df9;
    }
    bVar25 = pmVar6->ciphersuite_info->mac == MBEDTLS_MD_SHA384;
    pcVar22 = tls_prf_sha256;
    if (bVar25) {
      pcVar22 = tls_prf_sha384;
    }
    pcVar19 = ssl_calc_verify_tls_sha256;
    if (bVar25) {
      pcVar19 = ssl_calc_verify_tls_sha384;
    }
    pcVar20 = ssl_calc_finished_tls_sha256;
    if (bVar25) {
      pcVar20 = ssl_calc_finished_tls_sha384;
    }
  }
  pmVar5->tls_prf = pcVar22;
  pmVar5->calc_verify = pcVar19;
  pmVar5->calc_finished = pcVar20;
  if (pmVar5->resume == 0) {
    puVar1 = pmVar5->premaster;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x244,"premaster secret",puVar1,pmVar5->pmslen);
    if (ssl->handshake->extended_ms == 1) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x24c,"using extended master secret");
      (*ssl->handshake->calc_verify)(ssl,local_138);
      sVar21 = 0x24;
      if (ssl->minor_ver == 3) {
        sVar21 = (ulong)(ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384) << 4
                 | 0x20;
      }
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x261,"session hash",local_138,sVar21);
      iVar15 = (*pmVar5->tls_prf)(puVar1,pmVar5->pmslen,"extended master secret",local_138,sVar21,
                                  pmVar4->master,0x30);
      if (iVar15 != 0) {
        pcVar23 = "prf";
        line = 0x269;
        goto LAB_00163052;
      }
    }
    else {
      iVar15 = (*pmVar5->tls_prf)(puVar1,pmVar5->pmslen,"master secret",pmVar5->randbytes,0x40,
                                  pmVar4->master,0x30);
    }
    if (iVar15 != 0) {
      pcVar23 = "prf";
      line = 0x276;
      goto LAB_00163052;
    }
    lVar16 = 0;
    do {
      puVar1[lVar16] = '\0';
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x424);
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x27d,"no premaster (session resumed)");
  }
  puVar1 = pmVar5->randbytes;
  uVar7 = *(undefined8 *)pmVar5->randbytes;
  uVar8 = *(undefined8 *)(pmVar5->randbytes + 8);
  uVar9 = *(undefined8 *)(pmVar5->randbytes + 0x10);
  uVar10 = *(undefined8 *)(pmVar5->randbytes + 0x18);
  local_158 = *(undefined4 *)(pmVar5->randbytes + 0x20);
  uStack_154 = *(undefined4 *)(pmVar5->randbytes + 0x24);
  uStack_150 = *(undefined4 *)(pmVar5->randbytes + 0x28);
  uStack_14c = *(undefined4 *)(pmVar5->randbytes + 0x2c);
  local_148 = *(undefined4 *)(pmVar5->randbytes + 0x30);
  uStack_144 = *(undefined4 *)(pmVar5->randbytes + 0x34);
  uStack_140 = *(undefined4 *)(pmVar5->randbytes + 0x38);
  uStack_13c = *(undefined4 *)(pmVar5->randbytes + 0x3c);
  uVar11 = *(undefined8 *)(pmVar5->randbytes + 0x28);
  uVar12 = *(undefined8 *)(pmVar5->randbytes + 0x30);
  uVar13 = *(undefined8 *)(pmVar5->randbytes + 0x38);
  *(undefined8 *)pmVar5->randbytes = *(undefined8 *)(pmVar5->randbytes + 0x20);
  *(undefined8 *)(pmVar5->randbytes + 8) = uVar11;
  *(undefined8 *)(pmVar5->randbytes + 0x10) = uVar12;
  *(undefined8 *)(pmVar5->randbytes + 0x18) = uVar13;
  local_178._0_4_ = (undefined4)uVar7;
  local_178._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  uStack_170._0_4_ = (undefined4)uVar8;
  uStack_170._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_168._0_4_ = (undefined4)uVar9;
  local_168._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
  uStack_160._0_4_ = (undefined4)uVar10;
  uStack_160._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
  *(undefined4 *)(pmVar5->randbytes + 0x20) = (undefined4)local_178;
  *(undefined4 *)(pmVar5->randbytes + 0x24) = local_178._4_4_;
  *(undefined4 *)(pmVar5->randbytes + 0x28) = (undefined4)uStack_170;
  *(undefined4 *)(pmVar5->randbytes + 0x2c) = uStack_170._4_4_;
  *(undefined4 *)(pmVar5->randbytes + 0x30) = (undefined4)local_168;
  *(undefined4 *)(pmVar5->randbytes + 0x34) = local_168._4_4_;
  *(undefined4 *)(pmVar5->randbytes + 0x38) = (undefined4)uStack_160;
  *(undefined4 *)(pmVar5->randbytes + 0x3c) = uStack_160._4_4_;
  lVar16 = 0;
  local_178 = uVar7;
  uStack_170 = uVar8;
  local_168 = uVar9;
  uStack_160 = uVar10;
  do {
    *(undefined1 *)((long)&local_178 + lVar16) = 0;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x40);
  iVar15 = (*pmVar5->tls_prf)(pmVar4->master,0x30,"key expansion",puVar1,0x40,local_138,0x100);
  if (iVar15 != 0) {
    pcVar23 = "prf";
    line = 0x297;
    goto LAB_00163052;
  }
  pcVar23 = mbedtls_ssl_get_ciphersuite_name(pmVar4->ciphersuite);
  lVar16 = 0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x29c,"ciphersuite = %s",pcVar23);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x29d,"master secret",pmVar4->master,0x30);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x29e,"random bytes",puVar1,0x40);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x29f,"key block",local_138,0x100);
  do {
    puVar1[lVar16] = '\0';
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x40);
  pmVar6->keylen = cipher_info->key_bitlen >> 3;
  if ((cipher_info->mode == MBEDTLS_MODE_CCM) || (cipher_info->mode == MBEDTLS_MODE_GCM)) {
    pmVar6->maclen = 0;
    pmVar6->ivlen = 0xc;
    pmVar6->fixed_ivlen = 4;
    uVar17 = (ulong)((pmVar6->ciphersuite_info->flags & 2) == 0) * 8 + 0x10;
LAB_00162c68:
    pmVar6->minlen = uVar17;
  }
  else {
    iVar15 = mbedtls_md_setup(&pmVar6->md_ctx_enc,md_info,1);
    if ((iVar15 != 0) || (iVar15 = mbedtls_md_setup(&pmVar6->md_ctx_dec,md_info,1), iVar15 != 0)) {
      pcVar23 = "mbedtls_md_setup";
      line = 700;
      goto LAB_00163052;
    }
    bVar14 = mbedtls_md_get_size(md_info);
    pmVar6->maclen = (ulong)bVar14;
    uVar17 = 10;
    if (pmVar4->trunc_hmac != 1) {
      uVar17 = (ulong)bVar14;
    }
    pmVar6->maclen = uVar17;
    uVar3 = cipher_info->iv_size;
    pmVar6->ivlen = (ulong)uVar3;
    if (cipher_info->mode == MBEDTLS_MODE_STREAM) goto LAB_00162c68;
    sVar21 = uVar17 + cipher_info->block_size;
    if (pmVar4->encrypt_then_mac != 1) {
      sVar21 = sVar21 - uVar17 % (ulong)cipher_info->block_size;
    }
    pmVar6->minlen = sVar21;
    if (1 < (uint)ssl->minor_ver) {
      if (1 < ssl->minor_ver - 2U) {
        iVar15 = 0x2f8;
        goto LAB_00162df9;
      }
      pmVar6->minlen = pmVar6->minlen + (ulong)uVar3;
    }
  }
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x300,"keylen: %d, minlen: %d, ivlen: %d, maclen: %d",(ulong)pmVar6->keylen,
             pmVar6->minlen,(int)pmVar6->ivlen,pmVar6->maclen);
  uVar18 = *(uint *)&ssl->conf->field_0x164 & 1;
  puVar24 = local_138 + pmVar6->maclen * 2;
  uVar3 = pmVar6->keylen;
  puVar1 = puVar24 + uVar3;
  key_00 = local_138 + pmVar6->maclen;
  key_02 = puVar24;
  key = local_138;
  key_01 = puVar1;
  if (uVar18 != 0) {
    key_02 = puVar1;
    key = key_00;
    key_00 = local_138;
    key_01 = puVar24;
  }
  sVar21 = pmVar6->fixed_ivlen;
  if (sVar21 == 0) {
    sVar21 = pmVar6->ivlen;
  }
  memcpy(pmVar6->iv_enc + (uVar18 << 4),puVar1 + uVar3,sVar21);
  memcpy(pmVar6->iv_enc + (ulong)(uVar18 == 0) * 0x10,puVar1 + uVar3 + sVar21,sVar21);
  if (ssl->minor_ver == 0) {
    uVar17 = pmVar6->maclen;
    if (0x14 < uVar17) {
      iVar15 = 0x337;
      goto LAB_00162df9;
    }
    memcpy(pmVar6->mac_enc,key,uVar17);
    memcpy(pmVar6->mac_dec,key_00,uVar17);
  }
  else {
    if (ssl->minor_ver < 1) {
      iVar15 = 0x34a;
LAB_00162df9:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,iVar15,"should never happen");
      return -0x6c00;
    }
    mbedtls_md_hmac_starts(&pmVar6->md_ctx_enc,key,pmVar6->maclen);
    mbedtls_md_hmac_starts(&pmVar6->md_ctx_dec,key_00,pmVar6->maclen);
  }
  ctx = &pmVar6->cipher_ctx_enc;
  iVar15 = mbedtls_cipher_setup(ctx,cipher_info);
  if (iVar15 == 0) {
    ctx_00 = &pmVar6->cipher_ctx_dec;
    iVar15 = mbedtls_cipher_setup(ctx_00,cipher_info);
    if (iVar15 == 0) {
      iVar15 = mbedtls_cipher_setkey(ctx,key_02,cipher_info->key_bitlen,MBEDTLS_ENCRYPT);
      if (iVar15 == 0) {
        iVar15 = mbedtls_cipher_setkey(ctx_00,key_01,cipher_info->key_bitlen,MBEDTLS_DECRYPT);
        if (iVar15 == 0) {
          if (cipher_info->mode != MBEDTLS_MODE_CBC) {
LAB_001630fc:
            lVar16 = 0;
            do {
              local_138[lVar16] = '\0';
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x100);
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x3b4,"<= derive keys");
            return 0;
          }
          iVar15 = mbedtls_cipher_set_padding_mode(ctx,MBEDTLS_PADDING_NONE);
          if (iVar15 == 0) {
            iVar15 = mbedtls_cipher_set_padding_mode(ctx_00,MBEDTLS_PADDING_NONE);
            if (iVar15 == 0) goto LAB_001630fc;
            pcVar23 = "mbedtls_cipher_set_padding_mode";
            line = 0x38c;
          }
          else {
            pcVar23 = "mbedtls_cipher_set_padding_mode";
            line = 0x385;
          }
        }
        else {
          pcVar23 = "mbedtls_cipher_setkey";
          line = 0x37b;
        }
      }
      else {
        pcVar23 = "mbedtls_cipher_setkey";
        line = 0x373;
      }
    }
    else {
      pcVar23 = "mbedtls_cipher_setup";
      line = 0x36b;
    }
  }
  else {
    pcVar23 = "mbedtls_cipher_setup";
    line = 0x364;
  }
LAB_00163052:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,line,pcVar23,iVar15);
  return iVar15;
}

Assistant:

int mbedtls_ssl_derive_keys( mbedtls_ssl_context *ssl )
{
    int ret = 0;
    unsigned char tmp[64];
    unsigned char keyblk[256];
    unsigned char *key1;
    unsigned char *key2;
    unsigned char *mac_enc;
    unsigned char *mac_dec;
    size_t iv_copy_len;
    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;

    mbedtls_ssl_session *session = ssl->session_negotiate;
    mbedtls_ssl_transform *transform = ssl->transform_negotiate;
    mbedtls_ssl_handshake_params *handshake = ssl->handshake;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> derive keys" ) );

    cipher_info = mbedtls_cipher_info_from_type( transform->ciphersuite_info->cipher );
    if( cipher_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "cipher info for %d not found",
                            transform->ciphersuite_info->cipher ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    md_info = mbedtls_md_info_from_type( transform->ciphersuite_info->mac );
    if( md_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "mbedtls_md info for %d not found",
                            transform->ciphersuite_info->mac ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /*
     * Set appropriate PRF function and other SSL / TLS / TLS1.2 functions
     */
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        handshake->tls_prf = ssl3_prf;
        handshake->calc_verify = ssl_calc_verify_ssl;
        handshake->calc_finished = ssl_calc_finished_ssl;
    }
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        handshake->tls_prf = tls1_prf;
        handshake->calc_verify = ssl_calc_verify_tls;
        handshake->calc_finished = ssl_calc_finished_tls;
    }
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA512_C)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 &&
        transform->ciphersuite_info->mac == MBEDTLS_MD_SHA384 )
    {
        handshake->tls_prf = tls_prf_sha384;
        handshake->calc_verify = ssl_calc_verify_tls_sha384;
        handshake->calc_finished = ssl_calc_finished_tls_sha384;
    }
    else
#endif
#if defined(MBEDTLS_SHA256_C)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        handshake->tls_prf = tls_prf_sha256;
        handshake->calc_verify = ssl_calc_verify_tls_sha256;
        handshake->calc_finished = ssl_calc_finished_tls_sha256;
    }
    else
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /*
     * SSLv3:
     *   master =
     *     MD5( premaster + SHA1( 'A'   + premaster + randbytes ) ) +
     *     MD5( premaster + SHA1( 'BB'  + premaster + randbytes ) ) +
     *     MD5( premaster + SHA1( 'CCC' + premaster + randbytes ) )
     *
     * TLSv1+:
     *   master = PRF( premaster, "master secret", randbytes )[0..47]
     */
    if( handshake->resume == 0 )
    {
        MBEDTLS_SSL_DEBUG_BUF( 3, "premaster secret", handshake->premaster,
                       handshake->pmslen );

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
        if( ssl->handshake->extended_ms == MBEDTLS_SSL_EXTENDED_MS_ENABLED )
        {
            unsigned char session_hash[48];
            size_t hash_len;

            MBEDTLS_SSL_DEBUG_MSG( 3, ( "using extended master secret" ) );

            ssl->handshake->calc_verify( ssl, session_hash );

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
            {
#if defined(MBEDTLS_SHA512_C)
                if( ssl->transform_negotiate->ciphersuite_info->mac ==
                    MBEDTLS_MD_SHA384 )
                {
                    hash_len = 48;
                }
                else
#endif
                    hash_len = 32;
            }
            else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
                hash_len = 36;

            MBEDTLS_SSL_DEBUG_BUF( 3, "session hash", session_hash, hash_len );

            ret = handshake->tls_prf( handshake->premaster, handshake->pmslen,
                                      "extended master secret",
                                      session_hash, hash_len,
                                      session->master, 48 );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
                return( ret );
            }

        }
        else
#endif
        ret = handshake->tls_prf( handshake->premaster, handshake->pmslen,
                                  "master secret",
                                  handshake->randbytes, 64,
                                  session->master, 48 );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
            return( ret );
        }

        mbedtls_zeroize( handshake->premaster, sizeof(handshake->premaster) );
    }
    else
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "no premaster (session resumed)" ) );

    /*
     * Swap the client and server random values.
     */
    memcpy( tmp, handshake->randbytes, 64 );
    memcpy( handshake->randbytes, tmp + 32, 32 );
    memcpy( handshake->randbytes + 32, tmp, 32 );
    mbedtls_zeroize( tmp, sizeof( tmp ) );

    /*
     *  SSLv3:
     *    key block =
     *      MD5( master + SHA1( 'A'    + master + randbytes ) ) +
     *      MD5( master + SHA1( 'BB'   + master + randbytes ) ) +
     *      MD5( master + SHA1( 'CCC'  + master + randbytes ) ) +
     *      MD5( master + SHA1( 'DDDD' + master + randbytes ) ) +
     *      ...
     *
     *  TLSv1:
     *    key block = PRF( master, "key expansion", randbytes )
     */
    ret = handshake->tls_prf( session->master, 48, "key expansion",
                              handshake->randbytes, 64, keyblk, 256 );
    if( ret != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite = %s",
                   mbedtls_ssl_get_ciphersuite_name( session->ciphersuite ) ) );
    MBEDTLS_SSL_DEBUG_BUF( 3, "master secret", session->master, 48 );
    MBEDTLS_SSL_DEBUG_BUF( 4, "random bytes", handshake->randbytes, 64 );
    MBEDTLS_SSL_DEBUG_BUF( 4, "key block", keyblk, 256 );

    mbedtls_zeroize( handshake->randbytes, sizeof( handshake->randbytes ) );

    /*
     * Determine the appropriate key, IV and MAC length.
     */

    transform->keylen = cipher_info->key_bitlen / 8;

    if( cipher_info->mode == MBEDTLS_MODE_GCM ||
        cipher_info->mode == MBEDTLS_MODE_CCM )
    {
        transform->maclen = 0;

        transform->ivlen = 12;
        transform->fixed_ivlen = 4;

        /* Minimum length is expicit IV + tag */
        transform->minlen = transform->ivlen - transform->fixed_ivlen
                            + ( transform->ciphersuite_info->flags &
                                MBEDTLS_CIPHERSUITE_SHORT_TAG ? 8 : 16 );
    }
    else
    {
        /* Initialize HMAC contexts */
        if( ( ret = mbedtls_md_setup( &transform->md_ctx_enc, md_info, 1 ) ) != 0 ||
            ( ret = mbedtls_md_setup( &transform->md_ctx_dec, md_info, 1 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
            return( ret );
        }

        /* Get MAC length */
        transform->maclen = mbedtls_md_get_size( md_info );

#if defined(MBEDTLS_SSL_TRUNCATED_HMAC)
        /*
         * If HMAC is to be truncated, we shall keep the leftmost bytes,
         * (rfc 6066 page 13 or rfc 2104 section 4),
         * so we only need to adjust the length here.
         */
        if( session->trunc_hmac == MBEDTLS_SSL_TRUNC_HMAC_ENABLED )
            transform->maclen = MBEDTLS_SSL_TRUNCATED_HMAC_LEN;
#endif /* MBEDTLS_SSL_TRUNCATED_HMAC */

        /* IV length */
        transform->ivlen = cipher_info->iv_size;

        /* Minimum length */
        if( cipher_info->mode == MBEDTLS_MODE_STREAM )
            transform->minlen = transform->maclen;
        else
        {
            /*
             * GenericBlockCipher:
             * 1. if EtM is in use: one block plus MAC
             *    otherwise: * first multiple of blocklen greater than maclen
             * 2. IV except for SSL3 and TLS 1.0
             */
#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
            if( session->encrypt_then_mac == MBEDTLS_SSL_ETM_ENABLED )
            {
                transform->minlen = transform->maclen
                                  + cipher_info->block_size;
            }
            else
#endif
            {
                transform->minlen = transform->maclen
                                  + cipher_info->block_size
                                  - transform->maclen % cipher_info->block_size;
            }

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 ||
                ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_1 )
                ; /* No need to adjust minlen */
            else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_1) || defined(MBEDTLS_SSL_PROTO_TLS1_2)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_2 ||
                ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
            {
                transform->minlen += transform->ivlen;
            }
            else
#endif
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "keylen: %d, minlen: %d, ivlen: %d, maclen: %d",
                   transform->keylen, transform->minlen, transform->ivlen,
                   transform->maclen ) );

    /*
     * Finally setup the cipher contexts, IVs and MAC secrets.
     */
#if defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
    {
        key1 = keyblk + transform->maclen * 2;
        key2 = keyblk + transform->maclen * 2 + transform->keylen;

        mac_enc = keyblk;
        mac_dec = keyblk + transform->maclen;

        /*
         * This is not used in TLS v1.1.
         */
        iv_copy_len = ( transform->fixed_ivlen ) ?
                            transform->fixed_ivlen : transform->ivlen;
        memcpy( transform->iv_enc, key2 + transform->keylen,  iv_copy_len );
        memcpy( transform->iv_dec, key2 + transform->keylen + iv_copy_len,
                iv_copy_len );
    }
    else
#endif /* MBEDTLS_SSL_CLI_C */
#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
    {
        key1 = keyblk + transform->maclen * 2 + transform->keylen;
        key2 = keyblk + transform->maclen * 2;

        mac_enc = keyblk + transform->maclen;
        mac_dec = keyblk;

        /*
         * This is not used in TLS v1.1.
         */
        iv_copy_len = ( transform->fixed_ivlen ) ?
                            transform->fixed_ivlen : transform->ivlen;
        memcpy( transform->iv_dec, key1 + transform->keylen,  iv_copy_len );
        memcpy( transform->iv_enc, key1 + transform->keylen + iv_copy_len,
                iv_copy_len );
    }
    else
#endif /* MBEDTLS_SSL_SRV_C */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( transform->maclen > sizeof transform->mac_enc )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        memcpy( transform->mac_enc, mac_enc, transform->maclen );
        memcpy( transform->mac_dec, mac_dec, transform->maclen );
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_1 )
    {
        mbedtls_md_hmac_starts( &transform->md_ctx_enc, mac_enc, transform->maclen );
        mbedtls_md_hmac_starts( &transform->md_ctx_dec, mac_dec, transform->maclen );
    }
    else
#endif
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_init != NULL )
    {
        int ret = 0;

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_init()" ) );

        if( ( ret = mbedtls_ssl_hw_record_init( ssl, key1, key2, transform->keylen,
                                        transform->iv_enc, transform->iv_dec,
                                        iv_copy_len,
                                        mac_enc, mac_dec,
                                        transform->maclen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_init", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */

    if( ( ret = mbedtls_cipher_setup( &transform->cipher_ctx_enc,
                                 cipher_info ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setup", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setup( &transform->cipher_ctx_dec,
                                 cipher_info ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setup", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setkey( &transform->cipher_ctx_enc, key1,
                               cipher_info->key_bitlen,
                               MBEDTLS_ENCRYPT ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setkey", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setkey( &transform->cipher_ctx_dec, key2,
                               cipher_info->key_bitlen,
                               MBEDTLS_DECRYPT ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setkey", ret );
        return( ret );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( cipher_info->mode == MBEDTLS_MODE_CBC )
    {
        if( ( ret = mbedtls_cipher_set_padding_mode( &transform->cipher_ctx_enc,
                                             MBEDTLS_PADDING_NONE ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_set_padding_mode", ret );
            return( ret );
        }

        if( ( ret = mbedtls_cipher_set_padding_mode( &transform->cipher_ctx_dec,
                                             MBEDTLS_PADDING_NONE ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_set_padding_mode", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    mbedtls_zeroize( keyblk, sizeof( keyblk ) );

#if defined(MBEDTLS_ZLIB_SUPPORT)
    // Initialize compression
    //
    if( session->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ssl->compress_buf == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "Allocating compression buffer" ) );
            ssl->compress_buf = mbedtls_calloc( 1, MBEDTLS_SSL_BUFFER_LEN );
            if( ssl->compress_buf == NULL )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                                    MBEDTLS_SSL_BUFFER_LEN ) );
                return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
            }
        }

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "Initializing zlib states" ) );

        memset( &transform->ctx_deflate, 0, sizeof( transform->ctx_deflate ) );
        memset( &transform->ctx_inflate, 0, sizeof( transform->ctx_inflate ) );

        if( deflateInit( &transform->ctx_deflate,
                         Z_DEFAULT_COMPRESSION )   != Z_OK ||
            inflateInit( &transform->ctx_inflate ) != Z_OK )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "Failed to initialize compression" ) );
            return( MBEDTLS_ERR_SSL_COMPRESSION_FAILED );
        }
    }
#endif /* MBEDTLS_ZLIB_SUPPORT */

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= derive keys" ) );

    return( 0 );
}